

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

Image * __thiscall
pbrt::GBufferFilm::GetImage(GBufferFilm *this,ImageMetadata *metadata,Float splatScale)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_08;
  long in_RSI;
  Image *in_RDI;
  atomic<int> nClamped;
  ImageChannelDesc relVarianceDesc;
  ImageChannelDesc varianceDesc;
  ImageChannelDesc albedoRgbDesc;
  ImageChannelDesc uvDesc;
  ImageChannelDesc nsDesc;
  ImageChannelDesc nDesc;
  ImageChannelDesc dzDesc;
  ImageChannelDesc pDesc;
  ImageChannelDesc rgbDesc;
  PixelFormat format;
  Image *image;
  memory_order __b_1;
  memory_order __b;
  Bounds2<int> *in_stack_ffffffffffffef08;
  Bounds2<int> *v_09;
  Tuple2<pbrt::Vector2,_int> in_stack_ffffffffffffef10;
  anon_class_104_13_57f13b0e *in_stack_ffffffffffffef18;
  function<void_(pbrt::Point2<int>)> *in_stack_ffffffffffffef20;
  int *in_stack_ffffffffffffef38;
  allocator<char> *in_stack_ffffffffffffef40;
  function<void_(pbrt::Point2<int>)> *in_stack_ffffffffffffef48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef50;
  Image *in_stack_ffffffffffffefe8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffeff0;
  char *in_stack_fffffffffffff018;
  int in_stack_fffffffffffff024;
  char *in_stack_fffffffffffff028;
  undefined4 in_stack_fffffffffffff030;
  LogLevel in_stack_fffffffffffff034;
  PixelFormat in_stack_fffffffffffff03c;
  Image *in_stack_fffffffffffff040;
  Allocator in_stack_fffffffffffff048;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff050;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff060;
  string *local_f20;
  string *local_ed8;
  string *local_e90;
  string *local_e48;
  string *local_e10;
  string *local_dc8;
  string *local_d80;
  string *local_d48;
  string *local_d00;
  string *local_cb8;
  int local_a70;
  undefined1 local_a6c;
  allocator<char> local_a6b;
  allocator<char> local_a6a;
  allocator<char> local_a69;
  string *local_a68;
  string local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  string *local_a00;
  undefined8 local_9f8;
  undefined1 local_9ac;
  allocator<char> local_9ab;
  allocator<char> local_9aa;
  allocator<char> local_9a9;
  string *local_9a8;
  string local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  string *local_940;
  undefined8 local_938;
  undefined1 local_8ec;
  allocator<char> local_8eb;
  allocator<char> local_8ea;
  allocator<char> local_8e9;
  string *local_8e8;
  string local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  string *local_880;
  undefined8 local_878;
  undefined1 local_82b;
  allocator<char> local_82a;
  allocator<char> local_829;
  string *local_828;
  string local_820 [32];
  undefined1 local_800 [32];
  string *local_7e0;
  undefined8 local_7d8;
  undefined1 local_78c;
  allocator<char> local_78b;
  allocator<char> local_78a;
  allocator<char> local_789;
  string *local_788;
  string local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  string *local_720;
  undefined8 local_718;
  undefined1 local_6cc;
  allocator<char> local_6cb;
  allocator<char> local_6ca;
  allocator<char> local_6c9;
  string *local_6c8;
  string local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  string *local_660;
  undefined8 local_658;
  undefined1 local_60b;
  allocator<char> local_60a;
  allocator<char> local_609;
  string *local_608;
  string local_600 [32];
  undefined1 local_5e0 [32];
  string *local_5c0;
  undefined8 local_5b8;
  undefined1 local_56c;
  allocator<char> local_56b;
  allocator<char> local_56a;
  allocator<char> local_569;
  string *local_568;
  string local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  string *local_500;
  undefined8 local_4f8;
  undefined1 local_4ac;
  allocator<char> local_4ab;
  allocator<char> local_4aa;
  allocator<char> local_4a9;
  string *local_4a8;
  string local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  string *local_440;
  undefined8 local_438;
  Bounds2<int> *local_3f0;
  undefined1 local_3dd;
  allocator<char> local_3dc;
  allocator<char> local_3db;
  allocator<char> local_3da;
  allocator<char> local_3d9;
  allocator<char> local_3d8;
  allocator<char> local_3d7;
  allocator<char> local_3d6;
  allocator<char> local_3d5;
  allocator<char> local_3d4;
  allocator<char> local_3d3;
  allocator<char> local_3d2;
  allocator<char> local_3d1;
  allocator<char> local_3d0;
  allocator<char> local_3cf;
  allocator<char> local_3ce;
  allocator<char> local_3cd;
  allocator<char> local_3cc;
  allocator<char> local_3cb;
  allocator<char> local_3ca;
  allocator<char> local_3c9;
  allocator<char> local_3c8;
  allocator<char> local_3c7;
  allocator<char> local_3c6;
  allocator<char> local_3c5 [20];
  allocator<char> local_3b1;
  string *local_3b0;
  string local_3a8 [32];
  undefined1 local_388 [32];
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  undefined1 local_328 [32];
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  undefined1 local_208 [32];
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  string *local_88;
  undefined8 local_80;
  Tuple2<pbrt::Vector2,_int> local_64;
  byte local_51;
  int local_50;
  int local_2c;
  memory_order local_28;
  undefined4 local_24;
  int *local_20;
  int local_14;
  memory_order local_10;
  undefined4 local_c;
  int *local_8;
  
  if (logging::logLevel < 1) {
    Log(in_stack_fffffffffffff034,in_stack_fffffffffffff028,in_stack_fffffffffffff024,
        in_stack_fffffffffffff018);
  }
  local_50 = 2 - (*(byte *)(in_RSI + 0x33c) & 1);
  local_51 = 0;
  local_64 = (Tuple2<pbrt::Vector2,_int>)Bounds2<int>::Diagonal(in_stack_ffffffffffffef08);
  Point2<int>::Point2<int>(&in_stack_ffffffffffffef08->pMin,(Vector2<int>)in_stack_ffffffffffffef10)
  ;
  local_3dd = 1;
  local_3b0 = local_3a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_388;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_2e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_1c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3b0 = (string *)local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_3dd = 0;
  local_88 = local_3a8;
  local_80 = 0x19;
  v._M_len = (size_type)in_stack_ffffffffffffef20;
  v._M_array = (iterator)in_stack_ffffffffffffef18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffef10,v);
  ColorEncoding::TaggedPointer((ColorEncoding *)in_stack_ffffffffffffef10,in_stack_ffffffffffffef08)
  ;
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffef10);
  Image::Image(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
               (Point2i)in_stack_fffffffffffff060,in_stack_fffffffffffff050,
               (ColorEncoding *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               in_stack_fffffffffffff048);
  local_cb8 = (string *)&local_88;
  v_09 = local_3f0;
  do {
    local_cb8 = local_cb8 + -0x20;
    std::__cxx11::string::~string(local_cb8);
  } while (local_cb8 != local_3a8);
  std::allocator<char>::~allocator(&local_3dc);
  std::allocator<char>::~allocator(&local_3db);
  std::allocator<char>::~allocator(&local_3da);
  std::allocator<char>::~allocator(&local_3d9);
  std::allocator<char>::~allocator(&local_3d8);
  std::allocator<char>::~allocator(&local_3d7);
  std::allocator<char>::~allocator(&local_3d6);
  std::allocator<char>::~allocator(&local_3d5);
  std::allocator<char>::~allocator(&local_3d4);
  std::allocator<char>::~allocator(&local_3d3);
  std::allocator<char>::~allocator(&local_3d2);
  std::allocator<char>::~allocator(&local_3d1);
  std::allocator<char>::~allocator(&local_3d0);
  std::allocator<char>::~allocator(&local_3cf);
  std::allocator<char>::~allocator(&local_3ce);
  std::allocator<char>::~allocator(&local_3cd);
  std::allocator<char>::~allocator(&local_3cc);
  std::allocator<char>::~allocator(&local_3cb);
  std::allocator<char>::~allocator(&local_3ca);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::~allocator(&local_3c8);
  std::allocator<char>::~allocator(&local_3c7);
  std::allocator<char>::~allocator(&local_3c6);
  std::allocator<char>::~allocator(local_3c5);
  std::allocator<char>::~allocator(&local_3b1);
  local_4ac = 1;
  local_4a8 = local_4a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_4a8 = (string *)local_480;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_4a8 = (string *)local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_4ac = 0;
  local_440 = local_4a0;
  local_438 = 3;
  v_00._M_len = (size_type)in_stack_ffffffffffffef20;
  v_00._M_array = (iterator)in_stack_ffffffffffffef18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffef10,v_00);
  Image::GetChannelDesc(in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0);
  local_d00 = (string *)&local_440;
  do {
    local_d00 = local_d00 + -0x20;
    std::__cxx11::string::~string(local_d00);
  } while (local_d00 != local_4a0);
  std::allocator<char>::~allocator(&local_4ab);
  std::allocator<char>::~allocator(&local_4aa);
  std::allocator<char>::~allocator(&local_4a9);
  local_56c = 1;
  local_568 = local_560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_568 = (string *)local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_568 = (string *)local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_56c = 0;
  local_500 = local_560;
  local_4f8 = 3;
  v_01._M_len = (size_type)in_stack_ffffffffffffef20;
  v_01._M_array = (iterator)in_stack_ffffffffffffef18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffef10,v_01);
  Image::GetChannelDesc(in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0);
  local_d48 = (string *)&local_500;
  do {
    local_d48 = local_d48 + -0x20;
    std::__cxx11::string::~string(local_d48);
  } while (local_d48 != local_560);
  std::allocator<char>::~allocator(&local_56b);
  std::allocator<char>::~allocator(&local_56a);
  std::allocator<char>::~allocator(&local_569);
  local_60b = 1;
  local_608 = local_600;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_608 = (string *)local_5e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_60b = 0;
  local_5c0 = local_600;
  local_5b8 = 2;
  v_02._M_len = (size_type)in_stack_ffffffffffffef20;
  v_02._M_array = (iterator)in_stack_ffffffffffffef18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffef10,v_02);
  Image::GetChannelDesc(in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0);
  local_d80 = (string *)&local_5c0;
  do {
    local_d80 = local_d80 + -0x20;
    std::__cxx11::string::~string(local_d80);
  } while (local_d80 != local_600);
  std::allocator<char>::~allocator(&local_60a);
  std::allocator<char>::~allocator(&local_609);
  local_6cc = 1;
  local_6c8 = local_6c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_6c8 = (string *)local_6a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_6c8 = (string *)local_680;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_6cc = 0;
  local_660 = local_6c0;
  local_658 = 3;
  v_03._M_len = (size_type)in_stack_ffffffffffffef20;
  v_03._M_array = (iterator)in_stack_ffffffffffffef18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffef10,v_03);
  Image::GetChannelDesc(in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0);
  local_dc8 = (string *)&local_660;
  do {
    local_dc8 = local_dc8 + -0x20;
    std::__cxx11::string::~string(local_dc8);
  } while (local_dc8 != local_6c0);
  std::allocator<char>::~allocator(&local_6cb);
  std::allocator<char>::~allocator(&local_6ca);
  std::allocator<char>::~allocator(&local_6c9);
  local_78c = 1;
  local_788 = local_780;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_788 = (string *)local_760;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_788 = (string *)local_740;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_78c = 0;
  local_720 = local_780;
  local_718 = 3;
  v_04._M_len = (size_type)in_stack_ffffffffffffef20;
  v_04._M_array = (iterator)in_stack_ffffffffffffef18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffef10,v_04);
  Image::GetChannelDesc(in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0);
  local_e10 = (string *)&local_720;
  do {
    local_e10 = local_e10 + -0x20;
    std::__cxx11::string::~string(local_e10);
  } while (local_e10 != local_780);
  std::allocator<char>::~allocator(&local_78b);
  std::allocator<char>::~allocator(&local_78a);
  std::allocator<char>::~allocator(&local_789);
  local_82b = 1;
  local_828 = local_820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_828 = (string *)local_800;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_82b = 0;
  local_7e0 = local_820;
  local_7d8 = 2;
  v_05._M_len = (size_type)in_stack_ffffffffffffef20;
  v_05._M_array = (iterator)in_stack_ffffffffffffef18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffef10,v_05);
  Image::GetChannelDesc(in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0);
  local_e48 = (string *)&local_7e0;
  do {
    local_e48 = local_e48 + -0x20;
    std::__cxx11::string::~string(local_e48);
  } while (local_e48 != local_820);
  std::allocator<char>::~allocator(&local_82a);
  std::allocator<char>::~allocator(&local_829);
  local_8ec = 1;
  local_8e8 = local_8e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_8e8 = (string *)local_8c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_8e8 = (string *)local_8a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_8ec = 0;
  local_880 = local_8e0;
  local_878 = 3;
  v_06._M_len = (size_type)in_stack_ffffffffffffef20;
  v_06._M_array = (iterator)in_stack_ffffffffffffef18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffef10,v_06);
  Image::GetChannelDesc(in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0);
  local_e90 = (string *)&local_880;
  do {
    local_e90 = local_e90 + -0x20;
    std::__cxx11::string::~string(local_e90);
  } while (local_e90 != local_8e0);
  std::allocator<char>::~allocator(&local_8eb);
  std::allocator<char>::~allocator(&local_8ea);
  std::allocator<char>::~allocator(&local_8e9);
  local_9ac = 1;
  local_9a8 = local_9a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_9a8 = (string *)local_980;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_9a8 = (string *)local_960;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_9ac = 0;
  local_940 = local_9a0;
  local_938 = 3;
  v_07._M_len = (size_type)in_stack_ffffffffffffef20;
  v_07._M_array = (iterator)in_stack_ffffffffffffef18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffef10,v_07);
  Image::GetChannelDesc(in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0);
  local_ed8 = (string *)&local_940;
  do {
    local_ed8 = local_ed8 + -0x20;
    std::__cxx11::string::~string(local_ed8);
  } while (local_ed8 != local_9a0);
  std::allocator<char>::~allocator(&local_9ab);
  std::allocator<char>::~allocator(&local_9aa);
  std::allocator<char>::~allocator(&local_9a9);
  local_a6c = 1;
  local_a68 = local_a60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_a68 = (string *)local_a40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_a68 = (string *)local_a20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffef50,(char *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  local_a6c = 0;
  local_a00 = local_a60;
  local_9f8 = 3;
  v_08._M_len = (size_type)in_stack_ffffffffffffef20;
  v_08._M_array = (iterator)in_stack_ffffffffffffef18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffef10,v_08);
  Image::GetChannelDesc(in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0);
  local_f20 = (string *)&local_a00;
  do {
    local_f20 = local_f20 + -0x20;
    std::__cxx11::string::~string(local_f20);
  } while (local_f20 != local_a60);
  std::allocator<char>::~allocator(&local_a6b);
  std::allocator<char>::~allocator(&local_a6a);
  std::allocator<char>::~allocator(&local_a69);
  local_a70 = 0;
  std::function<void(pbrt::Point2<int>)>::
  function<pbrt::GBufferFilm::GetImage(pbrt::ImageMetadata*,float)::__0,void>
            (in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
  ParallelFor2D((Bounds2i *)in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  std::function<void_(pbrt::Point2<int>)>::~function((function<void_(pbrt::Point2<int>)> *)0x87187a)
  ;
  local_8 = &local_a70;
  local_c = 5;
  local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_14 = local_a70;
  if (0 < local_a70) {
    local_20 = &local_a70;
    local_24 = 5;
    local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_2c = local_a70;
    Warning<int>((char *)in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
  }
  pstd::optional<pbrt::Bounds2<int>_>::operator=
            ((optional<pbrt::Bounds2<int>_> *)in_stack_ffffffffffffef10,v_09);
  pstd::optional<pbrt::Point2<int>_>::operator=
            ((optional<pbrt::Point2<int>_> *)in_stack_ffffffffffffef10,&v_09->pMin);
  pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
            ((optional<const_pbrt::RGBColorSpace_*> *)in_stack_ffffffffffffef10,
             (RGBColorSpace **)v_09);
  local_51 = 1;
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x872998);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x8729a5);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x8729b2);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x8729bf);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x8729cc);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x8729d9);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x8729e6);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x8729f3);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x872a00);
  if ((local_51 & 1) == 0) {
    Image::~Image((Image *)in_stack_ffffffffffffef10);
  }
  return in_RDI;
}

Assistant:

Image GBufferFilm::GetImage(ImageMetadata *metadata, Float splatScale) {
    // Convert image to RGB and compute final pixel values
    LOG_VERBOSE("Converting image to RGB and computing final weighted pixel values");
    PixelFormat format = writeFP16 ? PixelFormat::Half : PixelFormat::Float;
    Image image(format, Point2i(pixelBounds.Diagonal()),
                {"R",
                 "G",
                 "B",
                 "Albedo.R",
                 "Albedo.G",
                 "Albedo.B",
                 "P.X",
                 "P.Y",
                 "P.Z",
                 "dzdx",
                 "dzdy",
                 "N.X",
                 "N.Y",
                 "N.Z",
                 "Ns.X",
                 "Ns.Y",
                 "Ns.Z",
                 "u",
                 "v",
                 "Variance.R",
                 "Variance.G",
                 "Variance.B",
                 "RelativeVariance.R",
                 "RelativeVariance.G",
                 "RelativeVariance.B"});

    ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
    ImageChannelDesc pDesc = image.GetChannelDesc({"P.X", "P.Y", "P.Z"});
    ImageChannelDesc dzDesc = image.GetChannelDesc({"dzdx", "dzdy"});
    ImageChannelDesc nDesc = image.GetChannelDesc({"N.X", "N.Y", "N.Z"});
    ImageChannelDesc nsDesc = image.GetChannelDesc({"Ns.X", "Ns.Y", "Ns.Z"});
    ImageChannelDesc uvDesc = image.GetChannelDesc({"u", "v"});
    ImageChannelDesc albedoRgbDesc =
        image.GetChannelDesc({"Albedo.R", "Albedo.G", "Albedo.B"});
    ImageChannelDesc varianceDesc =
        image.GetChannelDesc({"Variance.R", "Variance.G", "Variance.B"});
    ImageChannelDesc relVarianceDesc = image.GetChannelDesc(
        {"RelativeVariance.R", "RelativeVariance.G", "RelativeVariance.B"});

    std::atomic<int> nClamped{0};
    ParallelFor2D(pixelBounds, [&](Point2i p) {
        Pixel &pixel = pixels[p];
        RGB rgb(pixel.rgbSum[0], pixel.rgbSum[1], pixel.rgbSum[2]);
        RGB albedoRgb(pixel.rgbAlbedoSum[0], pixel.rgbAlbedoSum[1],
                      pixel.rgbAlbedoSum[2]);

        // Normalize pixel with weight sum
        Float weightSum = pixel.weightSum, gBufferWeightSum = pixel.gBufferWeightSum;
        Point3f pt = pixel.pSum;
        Point2f uv = pixel.uvSum;
        Float dzdx = pixel.dzdxSum, dzdy = pixel.dzdySum;
        if (weightSum != 0) {
            rgb /= weightSum;
            albedoRgb /= weightSum;
        }
        if (gBufferWeightSum != 0) {
            pt /= gBufferWeightSum;
            uv /= gBufferWeightSum;
            dzdx /= gBufferWeightSum;
            dzdy /= gBufferWeightSum;
        }

        // Add splat value at pixel
        for (int c = 0; c < 3; ++c)
            rgb[c] += splatScale * pixel.rgbSplat[c] / filterIntegral;

        rgb = outputRGBFromSensorRGB * rgb;

        if (writeFP16 && std::max({rgb.r, rgb.g, rgb.b}) > 65504) {
            if (rgb.r > 65504)
                rgb.r = 65504;
            if (rgb.g > 65504)
                rgb.g = 65504;
            if (rgb.b > 65504)
                rgb.b = 65504;
            ++nClamped;
        }

        Point2i pOffset(p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y);
        image.SetChannels(pOffset, rgbDesc, {rgb[0], rgb[1], rgb[2]});
        image.SetChannels(pOffset, albedoRgbDesc,
                          {albedoRgb[0], albedoRgb[1], albedoRgb[2]});

        Normal3f n =
            LengthSquared(pixel.nSum) > 0 ? Normalize(pixel.nSum) : Normal3f(0, 0, 0);
        Normal3f ns =
            LengthSquared(pixel.nsSum) > 0 ? Normalize(pixel.nsSum) : Normal3f(0, 0, 0);
        image.SetChannels(pOffset, pDesc, {pt.x, pt.y, pt.z});
        image.SetChannels(pOffset, dzDesc, {std::abs(dzdx), std::abs(dzdy)});
        image.SetChannels(pOffset, nDesc, {n.x, n.y, n.z});
        image.SetChannels(pOffset, nsDesc, {ns.x, ns.y, ns.z});
        image.SetChannels(pOffset, uvDesc, {uv[0], uv[1]});
        image.SetChannels(
            pOffset, varianceDesc,
            {pixel.rgbVariance[0].Variance(), pixel.rgbVariance[1].Variance(),
             pixel.rgbVariance[2].Variance()});
        image.SetChannels(pOffset, relVarianceDesc,
                          {pixel.rgbVariance[0].RelativeVariance(),
                           pixel.rgbVariance[1].RelativeVariance(),
                           pixel.rgbVariance[2].RelativeVariance()});
    });

    if (nClamped.load() > 0)
        Warning("%d pixel values clamped to maximum fp16 value.", nClamped.load());

    metadata->pixelBounds = pixelBounds;
    metadata->fullResolution = fullResolution;
    metadata->colorSpace = colorSpace;

    return image;
}